

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateRequiresForLibrary
          (Generator *this,GeneratorOptions *options,Printer *printer,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *provided)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference ppFVar6;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *in_RCX;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  bool in_stack_000000c5;
  bool in_stack_000000c6;
  bool in_stack_000000c7;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000c8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000d0;
  FieldDescriptor *extension;
  Printer *in_stack_000000e0;
  int j_1;
  Descriptor *desc;
  Generator *in_stack_000000f0;
  int j;
  int i;
  bool have_message;
  bool have_map;
  bool have_extensions;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  forwards;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  required;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  LogLevel in_stack_fffffffffffffe3c;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe48;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *in_stack_fffffffffffffe68;
  Descriptor *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  FieldDescriptor *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe90;
  string local_120 [32];
  FieldDescriptor *local_100;
  int local_f4;
  Descriptor *local_f0;
  int local_e4;
  int local_e0;
  undefined1 local_db;
  byte local_da;
  byte local_d9;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff40;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff48;
  FieldDescriptor *in_stack_ffffffffffffff50;
  GeneratorOptions *in_stack_ffffffffffffff58;
  Generator *in_stack_ffffffffffffff60;
  
  if (*(int *)((long)&in_RSI[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 4) != 0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe3c,
               (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe2c);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    internal::LogFinisher::operator=
              ((LogFinisher *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (LogMessage *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    internal::LogMessage::~LogMessage((LogMessage *)0x464927);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x464934);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x464941);
  local_d9 = 0;
  local_da = 0;
  local_db = 0;
  for (local_e0 = 0; uVar4 = (ulong)local_e0,
      sVar5 = std::
              vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::size(in_RCX), uVar4 < sVar5; local_e0 = local_e0 + 1) {
    local_e4 = 0;
    while( true ) {
      iVar1 = local_e4;
      ppFVar6 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::operator[](in_RCX,(long)local_e0);
      iVar3 = FileDescriptor::message_type_count(*ppFVar6);
      if (iVar3 <= iVar1) break;
      ppFVar6 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::operator[](in_RCX,(long)local_e0);
      local_f0 = FileDescriptor::message_type(*ppFVar6,local_e4);
      bVar2 = anon_unknown_0::IgnoreMessage((Descriptor *)0x464a2f);
      if (!bVar2) {
        FindRequiresForMessage
                  ((Generator *)in_stack_fffffffffffffe90,
                   (GeneratorOptions *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                   ,(Descriptor *)in_stack_fffffffffffffe80,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe70,(bool *)in_stack_fffffffffffffe68);
      }
      local_e4 = local_e4 + 1;
    }
    if ((local_d9 & 1) == 0) {
      std::
      vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::operator[](in_RCX,(long)local_e0);
      bVar2 = anon_unknown_0::HasExtensions
                        ((FileDescriptor *)
                         CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      if (bVar2) {
        local_d9 = 1;
      }
    }
    if ((local_da & 1) == 0) {
      in_stack_fffffffffffffe90 = in_RSI;
      std::
      vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::operator[](in_RCX,(long)local_e0);
      bVar2 = anon_unknown_0::FileHasMap
                        ((GeneratorOptions *)
                         CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                         (FileDescriptor *)
                         CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      if (bVar2) {
        local_da = 1;
      }
    }
    local_f4 = 0;
    while( true ) {
      in_stack_fffffffffffffe88 = local_f4;
      ppFVar6 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::operator[](in_RCX,(long)local_e0);
      in_stack_fffffffffffffe8c = FileDescriptor::extension_count(*ppFVar6);
      if (in_stack_fffffffffffffe8c <= in_stack_fffffffffffffe88) break;
      ppFVar6 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::operator[](in_RCX,(long)local_e0);
      in_stack_fffffffffffffe80 = FileDescriptor::extension(*ppFVar6,local_f4);
      local_100 = in_stack_fffffffffffffe80;
      in_stack_fffffffffffffe7f = anon_unknown_0::IgnoreField((FieldDescriptor *)0x464bfd);
      if (!(bool)in_stack_fffffffffffffe7f) {
        in_stack_fffffffffffffe70 = FieldDescriptor::containing_type(local_100);
        in_stack_fffffffffffffe68 = Descriptor::full_name_abi_cxx11_(in_stack_fffffffffffffe70);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28
                                                ));
        if (bVar2) {
          this_00 = in_RSI;
          FieldDescriptor::containing_type(local_100);
          (anonymous_namespace)::GetMessagePath_abi_cxx11_
                    ((GeneratorOptions *)
                     CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                     in_stack_fffffffffffffe70);
          pVar7 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(this_00,(value_type *)in_stack_fffffffffffffe48._M_node);
          in_stack_fffffffffffffe48 = pVar7.first._M_node;
          std::__cxx11::string::~string(local_120);
        }
        FindRequiresForField
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                   in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        local_d9 = 1;
      }
      local_f4 = local_f4 + 1;
    }
  }
  GenerateRequiresImpl
            (in_stack_000000f0,(GeneratorOptions *)desc,in_stack_000000e0,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)extension,in_stack_000000d0,in_stack_000000c8,in_stack_000000c7,in_stack_000000c6,
             in_stack_000000c5);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x464ddd);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x464dea);
  return;
}

Assistant:

void Generator::GenerateRequiresForLibrary(
    const GeneratorOptions& options, io::Printer* printer,
    const std::vector<const FileDescriptor*>& files,
    std::set<std::string>* provided) const {
  GOOGLE_CHECK_EQ(options.import_style, GeneratorOptions::kImportClosure);
  // For Closure imports we need to import every message type individually.
  std::set<std::string> required;
  std::set<std::string> forwards;
  bool have_extensions = false;
  bool have_map = false;
  bool have_message = false;

  for (int i = 0; i < files.size(); i++) {
    for (int j = 0; j < files[i]->message_type_count(); j++) {
      const Descriptor* desc = files[i]->message_type(j);
      if (!IgnoreMessage(desc)) {
        FindRequiresForMessage(options, desc, &required, &forwards,
                               &have_message);
      }
    }

    if (!have_extensions && HasExtensions(files[i])) {
      have_extensions = true;
    }

    if (!have_map && FileHasMap(options, files[i])) {
      have_map = true;
    }

    for (int j = 0; j < files[i]->extension_count(); j++) {
      const FieldDescriptor* extension = files[i]->extension(j);
      if (IgnoreField(extension)) {
        continue;
      }
      if (extension->containing_type()->full_name() !=
          "google.protobuf.bridge.MessageSet") {
        required.insert(GetMessagePath(options, extension->containing_type()));
      }
      FindRequiresForField(options, extension, &required, &forwards);
      have_extensions = true;
    }
  }

  GenerateRequiresImpl(options, printer, &required, &forwards, provided,
                       /* require_jspb = */ have_message,
                       /* require_extension = */ have_extensions,
                       /* require_map = */ have_map);
}